

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUnionFind.cpp
# Opt level: O1

void __thiscall btUnionFind::~btUnionFind(btUnionFind *this)

{
  Free(this);
  btAlignedObjectArray<btElement>::~btAlignedObjectArray(&this->m_elements);
  return;
}

Assistant:

btUnionFind::~btUnionFind()
{
	Free();

}